

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O1

void Gia_PolyCollectRoots_rec
               (Vec_Int_t *vAdds,Vec_Wec_t *vMap,Vec_Bit_t *vMarks,int iBox,Vec_Int_t *vRoots)

{
  int iVar1;
  int iBox_00;
  Vec_Int_t *pVVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = 0;
  while ((-1 < iBox && (lVar3 = (ulong)(uint)(iBox * 6) + lVar5, (int)lVar3 < vAdds->nSize))) {
    iVar1 = vAdds->pArray[lVar3];
    lVar3 = (long)iVar1;
    if ((lVar3 < 0) || (vMap->nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    if ((iVar1 != 0) && (pVVar2 = vMap->pArray, 1 < pVVar2[lVar3].nSize)) {
      lVar6 = 1;
      do {
        iBox_00 = pVVar2[lVar3].pArray[lVar6 + -1];
        if ((iBox_00 < 0) || (uVar4 = iBox_00 * 6 + 4, vAdds->nSize <= (int)uVar4))
        goto LAB_006637a9;
        if (vAdds->pArray[uVar4] == iVar1) {
          uVar4 = pVVar2[lVar3].pArray[lVar6];
          if (((int)uVar4 < 0) || (vMarks->nSize <= (int)uVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          if (((uint)vMarks->pArray[uVar4 >> 5] >> (uVar4 & 0x1f) & 1) == 0) {
            Vec_IntPush(vRoots,uVar4);
            Gia_PolyCollectRoots_rec(vAdds,vMap,vMarks,iBox_00,vRoots);
          }
        }
        lVar6 = lVar6 + 2;
      } while ((int)lVar6 < pVVar2[lVar3].nSize);
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 3) {
      return;
    }
  }
LAB_006637a9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_PolyCollectRoots_rec( Vec_Int_t * vAdds, Vec_Wec_t * vMap, Vec_Bit_t * vMarks, int iBox, Vec_Int_t * vRoots )
{
    int k;
    for ( k = 0; k < 3; k++ )
    {
        int i, Index, Sum, Carry = Vec_IntEntry( vAdds, 6*iBox+k );
        Vec_Int_t * vLevel = Vec_WecEntry( vMap, Carry );
        if ( Carry == 0 )
            continue;
        Vec_IntForEachEntryDouble( vLevel, Index, Sum, i )
            if ( Vec_IntEntry(vAdds, 6*Index+4) == Carry && !Vec_BitEntry(vMarks, Sum) )
            {
                Vec_IntPush( vRoots, Sum );
                Gia_PolyCollectRoots_rec( vAdds, vMap, vMarks, Index, vRoots );
            }
    }
}